

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

uint __thiscall
ON_MeshFaceList::SetFromTriangleList
          (ON_MeshFaceList *this,size_t triangle_count,size_t triangle_stride,uint *triangles)

{
  uint *triangles_local;
  size_t triangle_stride_local;
  size_t triangle_count_local;
  ON_MeshFaceList *this_local;
  
  if (((triangle_count == 0) || (triangle_stride < 3)) || (triangles == (uint *)0x0)) {
    this->m_bQuadFaces = false;
    this->m_face_count = 0;
    this->m_face_stride = 0;
    this->m_faces = (uint *)0x0;
  }
  else {
    this->m_bQuadFaces = false;
    this->m_face_count = (uint)triangle_count;
    this->m_face_stride = (uint)triangle_stride;
    this->m_faces = triangles;
  }
  return this->m_face_count;
}

Assistant:

unsigned int ON_MeshFaceList::SetFromTriangleList(
  size_t triangle_count,
  size_t triangle_stride,
  const unsigned int* triangles
  )
{
  if ( triangle_count > 0 && triangle_stride >= 3 && 0 != triangles )
  {
    m_bQuadFaces = false;
    m_face_count = (unsigned int)triangle_count;
    m_face_stride = (unsigned int)triangle_stride;
    m_faces = (const unsigned int*)triangles;
  }
  else
  {
    m_bQuadFaces = false;
    m_face_count = 0;
    m_face_stride = 0;
    m_faces = 0;
  }
  return m_face_count;
}